

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O3

void __thiscall
gss::innards::Proof::create_null_decision_bound(Proof *this,int p,int t,optional<int> d)

{
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var1;
  mapped_type *pmVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  key_type local_48;
  _Optional_payload_base<int> local_38;
  
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  if (((ulong)d.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
       >> 0x20 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(_Var1._M_head_impl)->field_0x1d8,"min:",4);
    if (p < 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 &((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  field_0x1d8," ;\n",3);
      return;
    }
    local_38._M_payload._M_value = p;
    uVar5 = 0;
    do {
      poVar3 = (ostream *)
               &((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                field_0x1d8;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," 1 x",4);
      local_48.first = uVar5;
      local_48.second = (long)t;
      pmVar2 = std::
               map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&((this->_imp)._M_t.
                              super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                              .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl
                             )->variable_mappings,&local_48);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      uVar5 = uVar5 + 1;
    } while ((uint)p != uVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                field_0x1d8," ;\n",3);
    if (0 < (int)local_38._M_payload) {
      uVar5 = 0;
      do {
        poVar3 = (ostream *)
                 &((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  field_0x558;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," 1 x",4);
        local_48.first = uVar5;
        local_48.second = (long)t;
        pmVar2 = std::
                 map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                               _M_head_impl)->variable_mappings,&local_48);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        uVar5 = uVar5 + 1;
      } while ((uint)p != uVar5);
    }
  }
  else {
    local_38 = (_Optional_payload_base<int>)
               d.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(_Var1._M_head_impl)->field_0x50,"* objective\n",0xc);
    if (0 < p) {
      uVar5 = 0;
      do {
        poVar3 = (ostream *)
                 &((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  field_0x50;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," 1 x",4);
        local_48.first = uVar5;
        local_48.second = (long)t;
        pmVar2 = std::
                 map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                               _M_head_impl)->variable_mappings,&local_48);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(pmVar2->_M_dataplus)._M_p,pmVar2->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        uVar5 = uVar5 + 1;
      } while ((uint)p != uVar5);
    }
    poVar3 = (ostream *)
             &((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->field_0x50;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,">= ",3);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,local_38._M_payload._M_value);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ;\n",3);
    _Var1._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    lVar4 = (_Var1._M_head_impl)->nb_constraints + 1;
    (_Var1._M_head_impl)->nb_constraints = lVar4;
    (_Var1._M_head_impl)->objective_line = lVar4;
  }
  return;
}

Assistant:

auto Proof::create_null_decision_bound(int p, int t, optional<int> d) -> void
{
    if (d) {
        _imp->model_stream << "* objective\n";
        for (int v = 0; v < p; ++v)
            _imp->model_stream << " 1 x" << _imp->variable_mappings[pair{v, t}] << " ";
        _imp->model_stream << ">= " << *d << " ;\n";
        _imp->objective_line = ++_imp->nb_constraints;
    }
    else {
        _imp->model_prelude_stream << "min:";
        for (int v = 0; v < p; ++v)
            _imp->model_prelude_stream << " 1 x" << _imp->variable_mappings[pair{v, t}] << " ";
        _imp->model_prelude_stream << " ;\n";

        for (int v = 0; v < p; ++v)
            _imp->objective_sum << " 1 x" << _imp->variable_mappings[pair{v, t}] << " ";
    }
}